

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateAddFileToPool
               (FileDescriptor *file,bool is_descriptor,Printer *printer)

{
  long lVar1;
  string *proto_file;
  size_t __n;
  Rep *pRVar2;
  size_type __n_00;
  int iVar3;
  FileDescriptor *pFVar4;
  Type *proto;
  void **ppvVar5;
  long lVar6;
  void **ppvVar7;
  int iVar8;
  long lVar9;
  undefined7 in_register_00000031;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  char *__end;
  string files_data;
  FileDescriptorSet files;
  string local_100;
  undefined1 local_e0 [24];
  RepeatedPtrFieldBase local_c8;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b0;
  Printer *local_a8;
  pointer local_a0;
  void **local_98;
  string local_90;
  string local_70;
  string local_50;
  
  io::Printer::Print(printer,
                     "public static $is_initialized = false;\n\npublic static function initOnce() {\n"
                    );
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\n\nif (static::$is_initialized == true) {\n  return;\n}\n"
                    );
  if ((int)CONCAT71(in_register_00000031,is_descriptor) == 0) {
    if (0 < *(int *)(file + 0x18)) {
      iVar8 = 0;
      do {
        pFVar4 = FileDescriptor::dependency(file,iVar8);
        proto_file = *(string **)pFVar4;
        __n = proto_file->_M_string_length;
        if ((__n != kDescriptorFile_abi_cxx11_._M_string_length) ||
           ((__n != 0 &&
            (iVar3 = bcmp((proto_file->_M_dataplus)._M_p,kDescriptorFile_abi_cxx11_._M_dataplus._M_p
                          ,__n), iVar3 != 0)))) {
          GeneratedMetadataFileName((string *)local_e0,proto_file,false);
          FilenameToClassname(&local_100,(string *)local_e0);
          io::Printer::Print(printer,"\\^name^::initOnce();\n","name",&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,
                            CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                     local_100.field_2._M_local_buf[0]) + 1);
          }
          if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < *(int *)(file + 0x18));
    }
    local_a8 = printer;
    FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_e0);
    proto = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                      (&local_c8,(Type *)0x0);
    FileDescriptor::CopyTo(file,proto);
    __n_00 = kDescriptorFile_abi_cxx11_._M_string_length;
    pRVar2 = (proto->dependency_).super_RepeatedPtrFieldBase.rep_;
    local_98 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      local_98 = (void **)0x0;
    }
    lVar6 = (long)(proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar6 != 0) {
      local_b0 = &proto->dependency_;
      local_a0 = kDescriptorFile_abi_cxx11_._M_dataplus._M_p;
      lVar9 = -8;
      uVar11 = 8;
      lVar12 = 0;
      do {
        if ((*(size_type *)((long)local_98[lVar12] + 8) != __n_00) ||
           ((__n_00 != 0 && (iVar8 = bcmp(*local_98[lVar12],local_a0,__n_00), iVar8 != 0)))) {
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::DeleteSubrange(local_b0,(int)lVar12,(int)(uVar11 >> 3) - (int)lVar12);
          break;
        }
        lVar12 = lVar12 + 1;
        uVar11 = uVar11 + 8;
        lVar1 = lVar6 * 8 + lVar9;
        lVar9 = lVar9 + -8;
      } while (lVar1 != 0);
    }
    internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(proto->extension_).super_RepeatedPtrFieldBase);
    if ((proto->message_type_).super_RepeatedPtrFieldBase.current_size_ != 0) {
      pRVar2 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
      ppvVar7 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
      do {
        internal::RepeatedPtrFieldBase::
        Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                  ((RepeatedPtrFieldBase *)((long)*ppvVar7 + 0x78));
        ppvVar7 = ppvVar7 + 1;
        pRVar2 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
        ppvVar5 = pRVar2->elements;
        if (pRVar2 == (Rep *)0x0) {
          ppvVar5 = (void **)0x0;
        }
      } while (ppvVar7 != ppvVar5 + (proto->message_type_).super_RepeatedPtrFieldBase.current_size_)
      ;
    }
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    MessageLite::SerializeToString((MessageLite *)local_e0,&local_100);
    printer = local_a8;
    io::Printer::Print(local_a8,"$pool->internalAddGeneratedFile(hex2bin(\n");
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    if (local_100._M_string_length != 0) {
      uVar11 = 0;
      do {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_100);
        BinaryToHex(&local_50,&local_70);
        uVar11 = uVar11 + 0x1e;
        pcVar10 = "";
        if (uVar11 < local_100._M_string_length) {
          pcVar10 = " .";
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,pcVar10,
                   pcVar10 + (ulong)(uVar11 < local_100._M_string_length) * 2);
        io::Printer::Print(printer,"\"^data^\"^dot^\n","data",&local_50,"dot",&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      } while (uVar11 < local_100._M_string_length);
    }
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"));\n\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
    FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_e0);
  }
  else {
    if (0 < *(int *)(file + 0x58)) {
      lVar9 = 0;
      lVar6 = 0;
      do {
        local_e0._0_8_ = local_e0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"","");
        GenerateMessageToPool
                  ((string *)local_e0,(Descriptor *)(*(long *)(file + 0x60) + lVar9),printer);
        if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
          operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
        }
        lVar6 = lVar6 + 1;
        lVar9 = lVar9 + 0xa8;
      } while (lVar6 < *(int *)(file + 0x58));
    }
    if (0 < *(int *)(file + 0x68)) {
      lVar6 = 0;
      lVar9 = 0;
      do {
        GenerateEnumToPool((EnumDescriptor *)(*(long *)(file + 0x70) + lVar6),printer);
        lVar9 = lVar9 + 1;
        lVar6 = lVar6 + 0x38;
      } while (lVar9 < *(int *)(file + 0x68));
    }
    io::Printer::Print(printer,"$pool->finish();\n");
  }
  io::Printer::Print(printer,"static::$is_initialized = true;\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void GenerateAddFileToPool(const FileDescriptor* file, bool is_descriptor,
                           io::Printer* printer) {
    printer->Print(
        "public static $is_initialized = false;\n\n"
        "public static function initOnce() {\n");
    Indent(printer);

    printer->Print(
        "$pool = \\Google\\Protobuf\\Internal\\"
        "DescriptorPool::getGeneratedPool();\n\n"
        "if (static::$is_initialized == true) {\n"
        "  return;\n"
        "}\n");

  if (is_descriptor) {
    for (int i = 0; i < file->message_type_count(); i++) {
      GenerateMessageToPool("", file->message_type(i), printer);
    }
    for (int i = 0; i < file->enum_type_count(); i++) {
      GenerateEnumToPool(file->enum_type(i), printer);
    }

    printer->Print(
        "$pool->finish();\n");
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const std::string& name = file->dependency(i)->name();
      // Currently, descriptor.proto is not ready for external usage. Skip to
      // import it for now, so that its dependencies can still work as long as
      // they don't use protos defined in descriptor.proto.
      if (name == kDescriptorFile) {
        continue;
      }
      std::string dependency_filename =
          GeneratedMetadataFileName(name, is_descriptor);
      printer->Print(
          "\\^name^::initOnce();\n",
          "name", FilenameToClassname(dependency_filename));
    }

    // Add messages and enums to descriptor pool.
    FileDescriptorSet files;
    FileDescriptorProto* file_proto = files.add_file();
    file->CopyTo(file_proto);

    // Filter out descriptor.proto as it cannot be depended on for now.
    RepeatedPtrField<string>* dependency = file_proto->mutable_dependency();
    for (RepeatedPtrField<string>::iterator it = dependency->begin();
         it != dependency->end(); ++it) {
      if (*it != kDescriptorFile) {
        dependency->erase(it);
        break;
      }
    }

    // Filter out all extensions, since we do not support extension yet.
    file_proto->clear_extension();
    RepeatedPtrField<DescriptorProto>* message_type =
        file_proto->mutable_message_type();
    for (RepeatedPtrField<DescriptorProto>::iterator it = message_type->begin();
         it != message_type->end(); ++it) {
      it->clear_extension();
    }

    string files_data;
    files.SerializeToString(&files_data);

    printer->Print("$pool->internalAddGeneratedFile(hex2bin(\n");
    Indent(printer);

    // Only write 30 bytes per line.
    static const int kBytesPerLine = 30;
    for (int i = 0; i < files_data.size(); i += kBytesPerLine) {
      printer->Print(
          "\"^data^\"^dot^\n",
          "data", BinaryToHex(files_data.substr(i, kBytesPerLine)),
          "dot", i + kBytesPerLine < files_data.size() ? " ." : "");
    }

    Outdent(printer);
    printer->Print(
        "));\n\n");
  }
  printer->Print(
      "static::$is_initialized = true;\n");
  Outdent(printer);
  printer->Print("}\n");
}